

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiments.cpp
# Opt level: O3

void IFLT(ffe_t *data,uint size,uint index)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  ffe_t fVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ushort uVar11;
  
  if (1 < size) {
    uVar5 = 1;
    do {
      uVar4 = uVar5 * 2;
      uVar9 = 0;
      uVar8 = uVar5;
      do {
        if (uVar8 - uVar5 < uVar8) {
          lVar10 = 0;
          uVar1 = skewVec[(index - 1) + uVar8];
          do {
            uVar7 = uVar8 + (int)lVar10;
            uVar2 = data[uVar9 + lVar10];
            uVar3 = data[uVar7];
            uVar11 = uVar3 ^ uVar2;
            data[uVar7] = uVar11;
            if (uVar1 != 0xffff) {
              if (uVar3 == uVar2) {
                fVar6 = 0;
              }
              else {
                uVar7 = (uint)GFLog[uVar11] + (uint)uVar1;
                fVar6 = GFExp[(uVar7 >> 0x10) + uVar7 & 0xffff];
              }
              data[uVar9 + lVar10] = data[uVar9 + lVar10] ^ fVar6;
            }
            lVar10 = lVar10 + 1;
          } while (uVar8 - uVar9 != lVar10);
        }
        uVar8 = uVar8 + uVar4;
        uVar9 = (ulong)((int)uVar9 + uVar4);
      } while (uVar8 < size);
      uVar5 = uVar4;
    } while (uVar4 < size);
  }
  return;
}

Assistant:

static void IFLT(ffe_t* data, const unsigned size, const unsigned index)
{
    for (unsigned width = 1; width < size; width <<= 1)
    {
        for (unsigned j = width; j < size; j += (width << 1))
        {
            const ffe_t skew = skewVec[j + index - 1];

            for (unsigned i = j - width; i < j; ++i)
                ifft_butterfly(data[i], data[i + width], skew);
        }
    }
}